

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m2v_basic.c
# Opt level: O1

_Bool mptest_el_access2(int nrow,int ncol,m256v *Ml,m2v *Ms)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  _Bool _Var6;
  
  _Var6 = false;
  uVar4 = 0;
  while( true ) {
    iVar1 = rand();
    iVar2 = rand();
    uVar3 = iVar2 % ncol;
    uVar5 = uVar3 + 0x1f;
    if (-1 < (int)uVar3) {
      uVar5 = uVar3;
    }
    if (((Ms->e[((int)uVar5 >> 5) + (iVar1 % nrow) * Ms->row_stride] >> (uVar3 & 0x1f) & 1) != 0) !=
        (bool)Ml->e[(long)(int)uVar3 + Ml->rstride * (long)(iVar1 % nrow)]) break;
    _Var6 = 0x3e6 < uVar4;
    uVar4 = uVar4 + 1;
    if (uVar4 == 1000) {
      return _Var6;
    }
  }
  return _Var6;
}

Assistant:

static bool mptest_el_access2(int nrow, int ncol, m256v* Ml, m2v* Ms)
{
	const int niter = 1000;
	for (int N = 0; N < niter; ++N) {
		const int r = rand() % nrow;
		const int c = rand() % ncol;
		if (m256v_get_el(Ml, r, c) != m2v_get_el(Ms, r, c))
			return false;
	}
	return true;
}